

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseExp
          (ParserImpl *this,
          unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *left,TokenDetail op,
          int left_priority)

{
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar1;
  String *pSVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  pointer pUVar6;
  undefined8 uVar7;
  TokenDetail *pTVar8;
  anon_union_8_2_010d16d7_for_TokenDetail_0 *paVar9;
  int in_ECX;
  ParserImpl *in_RDX;
  ParserImpl *in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  TokenDetail in_stack_00000000;
  int right_priority;
  unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_> unexp;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> exp;
  anon_union_8_2_010d16d7_for_TokenDetail_0 in_stack_fffffffffffffdf8;
  ParserImpl *in_stack_fffffffffffffe00;
  anon_union_8_2_010d16d7_for_TokenDetail_0 in_stack_fffffffffffffe08;
  String *in_stack_fffffffffffffe10;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffe18;
  BinaryExpression *in_stack_fffffffffffffe20;
  BinaryExpression *this_00;
  ParserImpl *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  char *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined1 local_118 [63];
  undefined1 local_d9;
  undefined4 local_bc;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_b8;
  ParserImpl *pPStack_b0;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_a8;
  String *pSStack_a0;
  int local_7c;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_70;
  ParserImpl *pPStack_68;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_60;
  String *pSStack_58;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_fffffffffffffe00);
  LookAhead(in_stack_fffffffffffffe00);
  if ((((in_RSI->look_ahead_).token_ == 0x2d) || ((in_RSI->look_ahead_).token_ == 0x23)) ||
     ((in_RSI->look_ahead_).token_ == 0x10d)) {
    NextToken(in_stack_fffffffffffffe00);
    operator_new(0x30);
    luna::UnaryExpression::UnaryExpression((UnaryExpression *)in_stack_fffffffffffffe10);
    std::unique_ptr<luna::UnaryExpression,std::default_delete<luna::UnaryExpression>>::
    unique_ptr<std::default_delete<luna::UnaryExpression>,void>
              ((unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_> *)
               in_stack_fffffffffffffe00,(pointer)in_stack_fffffffffffffdf8.str_);
    pUVar6 = std::unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_>::
             operator->((unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_>
                         *)0x1d6d6a);
    aVar1 = (in_RSI->current_).field_0;
    pSVar2 = (in_RSI->current_).module_;
    iVar3 = (in_RSI->current_).column_;
    iVar4 = (in_RSI->current_).token_;
    *(undefined8 *)((long)&(pUVar6->op_token_).module_ + 4) =
         *(undefined8 *)((long)&(in_RSI->current_).module_ + 4);
    (pUVar6->op_token_).column_ = iVar3;
    (pUVar6->op_token_).token_ = iVar4;
    (pUVar6->op_token_).field_0 = aVar1;
    (pUVar6->op_token_).module_ = pSVar2;
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffe00);
    luna::TokenDetail::TokenDetail((TokenDetail *)&local_70);
    ParseExp(in_RDX,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                    CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_00000000,
             in_stack_ffffffffffffffdc);
    std::unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_>::operator->
              ((unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_> *)
               0x1d6de9);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pPStack_68,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_70.str_
              );
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pSStack_58);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pSStack_58);
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)pSStack_58,
               (unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_> *)
               local_60.str_);
    std::unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_>::~unique_ptr
              ((unique_ptr<luna::UnaryExpression,_std::default_delete<luna::UnaryExpression>_> *)
               pPStack_68);
    in_stack_fffffffffffffdf8 = local_70;
    in_stack_fffffffffffffe00 = pPStack_68;
    in_stack_fffffffffffffe08 = local_60;
    in_stack_fffffffffffffe10 = pSStack_58;
  }
  else {
    bVar5 = IsMainExp(in_RSI,&in_RSI->look_ahead_);
    if (!bVar5) {
      uVar7 = __cxa_allocate_exception(0x20);
      luna::ParseException::ParseException
                ((ParseException *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe78,
                 (TokenDetail *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
      __cxa_throw(uVar7,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
    }
    ParseMainExp(in_stack_fffffffffffffe68);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffe00,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffdf8.str_);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffe10);
  }
  do {
    pTVar8 = LookAhead(in_stack_fffffffffffffe00);
    local_7c = GetOpPriority(in_RSI,pTVar8);
    if (local_7c <= in_ECX) {
      if (in_ECX != local_7c) {
LAB_001d7118:
        if (in_ECX == local_7c) {
          if (in_ECX == 0) {
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffdf8.str_);
          }
          else {
            bVar5 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                *)0x1d7168);
            if (!bVar5) {
              __assert_fail("left",
                            "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                            ,0x49,
                            "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseExp(std::unique_ptr<SyntaxTree>, TokenDetail, int)"
                           );
            }
            operator_new(0x38);
            local_d9 = 1;
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffdf8.str_);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffdf8.str_);
            luna::BinaryExpression::BinaryExpression
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10,(TokenDetail *)in_stack_fffffffffffffe08.str_);
            local_d9 = 0;
            std::unique_ptr<luna::BinaryExpression,std::default_delete<luna::BinaryExpression>>::
            unique_ptr<std::default_delete<luna::BinaryExpression>,void>
                      ((unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>
                        *)in_stack_fffffffffffffe00,(pointer)in_stack_fffffffffffffdf8.str_);
            std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::operator=
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10,
                       (unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>
                        *)in_stack_fffffffffffffe08.str_);
            std::unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>::
            ~unique_ptr((unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>
                         *)in_stack_fffffffffffffe00);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffdf8.str_);
            pTVar8 = NextToken(in_stack_fffffffffffffe00);
            local_118._16_8_ = pTVar8->field_0;
            local_118._24_8_ = pTVar8->module_;
            local_118._32_8_ = *(undefined8 *)&pTVar8->line_;
            in_stack_fffffffffffffe10 = *(String **)&pTVar8->token_;
            local_118._40_8_ = in_stack_fffffffffffffe10;
            ParseExp(in_RDX,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                            CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_00000000,
                     in_stack_ffffffffffffffdc);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10);
          }
        }
        else {
          bVar5 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *
                             )0x1d736f);
          if (bVar5) {
            operator_new(0x38);
            this_00 = (BinaryExpression *)local_118;
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffdf8.str_);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe00,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffdf8.str_);
            luna::BinaryExpression::BinaryExpression
                      (this_00,in_stack_fffffffffffffe18,
                       (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10,(TokenDetail *)in_stack_fffffffffffffe08.str_);
            std::unique_ptr<luna::BinaryExpression,std::default_delete<luna::BinaryExpression>>::
            unique_ptr<std::default_delete<luna::BinaryExpression>,void>
                      ((unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>
                        *)in_stack_fffffffffffffe00,(pointer)in_stack_fffffffffffffdf8.str_);
            std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::operator=
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10,
                       (unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>
                        *)in_stack_fffffffffffffe08.str_);
            std::unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>::
            ~unique_ptr((unique_ptr<luna::BinaryExpression,_std::default_delete<luna::BinaryExpression>_>
                         *)in_stack_fffffffffffffe00);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10);
            std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                      ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_fffffffffffffe10);
          }
          std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     in_stack_fffffffffffffe00,
                     (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     in_stack_fffffffffffffdf8.str_);
        }
        local_bc = 1;
        std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                  ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_fffffffffffffe10);
        return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
               )(tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
                in_RDI.
                super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
                .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
                super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      pTVar8 = LookAhead(in_stack_fffffffffffffe00);
      bVar5 = IsRightAssociation(in_RSI,pTVar8);
      if (!bVar5) goto LAB_001d7118;
    }
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffe00,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffdf8.str_);
    paVar9 = &NextToken(in_stack_fffffffffffffe00)->field_0;
    in_stack_fffffffffffffdf8 = (anon_union_8_2_010d16d7_for_TokenDetail_0)paVar9->str_;
    in_stack_fffffffffffffe00 = (ParserImpl *)paVar9[1].str_;
    in_stack_fffffffffffffe08 = paVar9[2];
    in_stack_fffffffffffffe10 = paVar9[3].str_;
    local_b8 = in_stack_fffffffffffffdf8;
    pPStack_b0 = in_stack_fffffffffffffe00;
    local_a8 = in_stack_fffffffffffffe08;
    pSStack_a0 = in_stack_fffffffffffffe10;
    ParseExp(in_RDX,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                    CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_00000000,
             in_stack_ffffffffffffffdc);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffe00,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffdf8.str_);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffe10);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_fffffffffffffe10);
  } while( true );
}

Assistant:

std::unique_ptr<SyntaxTree> ParseExp(std::unique_ptr<SyntaxTree> left = std::unique_ptr<SyntaxTree>(),
                                             TokenDetail op = TokenDetail(),
                                             int left_priority = 0)
        {
            std::unique_ptr<SyntaxTree> exp;
            LookAhead();

            if (look_ahead_.token_ == '-' || look_ahead_.token_ == '#' || look_ahead_.token_ == Token_Not)
            {
                NextToken();
                std::unique_ptr<UnaryExpression> unexp(new UnaryExpression);
                unexp->op_token_ = current_;
                unexp->exp_ = ParseExp(std::unique_ptr<SyntaxTree>(), TokenDetail(), 90);
                exp = std::move(unexp);
            }
            else if (IsMainExp(look_ahead_))
                exp = ParseMainExp();
            else
                throw ParseException("unexpect token for exp.", look_ahead_);

            while (true)
            {
                int right_priority = GetOpPriority(LookAhead());
                if (left_priority < right_priority ||
                    (left_priority == right_priority && IsRightAssociation(LookAhead())))
                {
                    exp = ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else if (left_priority == right_priority)
                {
                    if (left_priority == 0)
                        return exp;
                    assert(left);
                    exp = std::unique_ptr<BinaryExpression>(
                        new BinaryExpression(std::move(left), std::move(exp), op));
                    return ParseExp(std::move(exp), NextToken(), right_priority);
                }
                else
                {
                    if (left)
                        exp = std::unique_ptr<BinaryExpression>(
                            new BinaryExpression(std::move(left), std::move(exp), op));
                    return exp;
                }
            }
        }